

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccumulatorView.hpp
# Opt level: O2

void __thiscall
OpenMD::Utils::AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_>::
writeErrorBars(AccumulatorView<OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>_> *this,
              ostream *stream,string *errorMessage,ErrorHandling errorHandling)

{
  Vector3dAccumulator *this_00;
  size_t sVar1;
  int i;
  long lVar2;
  Vector3d err;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  Vector<double,_3U>::Vector(&local_60);
  this_00 = &this->super_Vector3dAccumulator;
  sVar1 = (this->super_Vector3dAccumulator).Count_;
  if (errorHandling == Variance) {
    Accumulator<OpenMD::Vector<double,_3U>_>::getVariance(&local_48,this_00);
  }
  else if (errorHandling == StdDev) {
    Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev(&local_48,this_00);
  }
  else {
    if (errorHandling != CI95) goto LAB_00226826;
    Accumulator<OpenMD::Vector<double,_3U>_>::get95percentConfidenceInterval(&local_48,this_00);
  }
  Vector3<double>::operator=((Vector3<double> *)&local_60,&local_48);
LAB_00226826:
  lVar2 = 0;
  while( true ) {
    Vector<double,_3U>::Vector(&local_48,&(this->super_Vector3dAccumulator).Avg_);
    if (lVar2 == 3) break;
    if (errorHandling == CI95 && sVar1 == 0) {
      std::operator<<(stream,"\t");
    }
    else if ((ulong)ABS(local_60.data_[lVar2]) < 0x7ff0000000000000) {
      std::operator<<(stream,"\t");
      if (sVar1 != 0) {
        std::ostream::_M_insert<double>(local_60.data_[lVar2]);
      }
    }
    else {
      snprintf(painCave.errMsg,2000,"%s",(errorMessage->_M_dataplus)._M_p);
      painCave.isFatal = 1;
      simError();
    }
    lVar2 = lVar2 + 1;
  }
  return;
}

Assistant:

void writeErrorBars(std::ostream& stream, const std::string& errorMessage,
                        ErrorHandling errorHandling) const override {
      Vector3d err;
      std::size_t count = Vector3dAccumulator::getCount();

      switch (errorHandling) {
      case ErrorHandling::CI95:
        err = Vector3dAccumulator::get95percentConfidenceInterval();
        break;
      case ErrorHandling::StdDev:
        err = Vector3dAccumulator::getStdDev();
        break;
      case ErrorHandling::Variance:
        err = Vector3dAccumulator::getVariance();
        break;
      default:
        break;
      }

      for (int i = 0; i < Vector3dAccumulator::getAverage().size(); i++) {
        if (count == 0 && errorHandling == ErrorHandling::CI95) {
          stream << "\t";
        } else {
          if (std::isinf(err[i]) || std::isnan(err[i])) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH, "%s",
                     errorMessage.c_str());
            painCave.isFatal = 1;
            simError();
          } else {
            if (count == 0)
              stream << "\t";
            else
              stream << "\t" << err[i];
          }
        }
      }
    }